

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O0

void __thiscall
PolyFit<double>::dataToEigenSubset
          (PolyFit<double> *this,set<int,_std::less<int>,_std::allocator<int>_> *indexSet)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference piVar4;
  reference pvVar5;
  Scalar *pSVar6;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_RDI;
  iterator it;
  int cnt;
  int nVal;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  int local_18;
  undefined4 local_14;
  
  sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2496b2);
  local_14 = (undefined4)sVar3;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI,
             (Index)in_stack_ffffffffffffffc8,(Index)in_stack_ffffffffffffffc0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI,
             (Index)in_stack_ffffffffffffffc8,(Index)in_stack_ffffffffffffffc0);
  local_18 = 0;
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    this_00 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9d8);
    piVar4 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x249745);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*piVar4);
    vVar1 = *pvVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_RDI,(Index)in_stack_ffffffffffffffc8,(Index)in_stack_ffffffffffffffc0);
    *pSVar6 = vVar1;
    in_stack_ffffffffffffffc0 = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x9e0);
    piVar4 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x24979e);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffffc0,(long)*piVar4);
    in_stack_ffffffffffffffc8 = *pvVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_RDI,(Index)in_stack_ffffffffffffffc8,(Index)in_stack_ffffffffffffffc0);
    *pSVar6 = in_stack_ffffffffffffffc8;
    local_18 = local_18 + 1;
    std::_Rb_tree_const_iterator<int>::operator++((_Rb_tree_const_iterator<int> *)this_00);
  }
  return;
}

Assistant:

void dataToEigenSubset(std::set<int> &indexSet)
    {
      int nVal = static_cast<int>(indexSet.size());
      xM.resize(nVal,1);
      yM.resize(nVal,1);
      
      int cnt = 0;  
      std::set<int>::iterator it = indexSet.begin();
      while (it != indexSet.end())
      {
        xM(cnt,0) = x[*it];
        yM(cnt,0) = y[*it];
        ++cnt; ++it;
      }
    }